

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMesh.h
# Opt level: O0

IMeshBuffer * __thiscall irr::scene::SMesh::getMeshBuffer(SMesh *this,SMaterial *material)

{
  bool bVar1;
  IMeshBuffer **ppIVar2;
  SMaterial *in_RSI;
  s32 i;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  SMaterial *this_00;
  u32 local_1c;
  
  local_1c = core::array<irr::scene::IMeshBuffer_*>::size
                       ((array<irr::scene::IMeshBuffer_*> *)0x2dc7c1);
  do {
    local_1c = local_1c - 1;
    if ((int)local_1c < 0) {
      return (IMeshBuffer *)0x0;
    }
    this_00 = in_RSI;
    ppIVar2 = core::array<irr::scene::IMeshBuffer_*>::operator[]
                        ((array<irr::scene::IMeshBuffer_*> *)in_RSI,in_stack_ffffffffffffffcc);
    (**(*ppIVar2)->_vptr_IMeshBuffer)();
    bVar1 = video::SMaterial::operator==
                      (this_00,(SMaterial *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  } while (!bVar1);
  ppIVar2 = core::array<irr::scene::IMeshBuffer_*>::operator[]
                      ((array<irr::scene::IMeshBuffer_*> *)this_00,in_stack_ffffffffffffffcc);
  return *ppIVar2;
}

Assistant:

IMeshBuffer *getMeshBuffer(const video::SMaterial &material) const override
	{
		for (s32 i = (s32)MeshBuffers.size() - 1; i >= 0; --i) {
			if (material == MeshBuffers[i]->getMaterial())
				return MeshBuffers[i];
		}

		return 0;
	}